

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_1::ImageViewTest::initPrograms
          (ImageViewTest *this,SourceCollections *sourceCollections)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VkImageViewType VVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  CompressedTexFormat format;
  TextureChannelClass TVar6;
  TextureFormat TVar7;
  ostream *poVar8;
  size_t sVar9;
  ProgramSources *pPVar10;
  char *pcVar11;
  char *__s;
  Vec4 swizzledBias;
  Vec4 swizzledScale;
  Vec4 lookupBias;
  Vec4 lookupScale;
  ostringstream fragmentSrc;
  ostringstream vertexSrc;
  string local_518;
  long *local_4f8;
  long local_4f0;
  long local_4e8 [2];
  Vector<float,_4> local_4d8;
  Vector<float,_4> local_4c8;
  Vec4 local_4b8;
  Vec4 local_4a8;
  ulong local_498;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_480 [5];
  ios_base local_428 [264];
  long local_320 [3];
  uint auStack_308 [22];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  ChannelType channelType;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  bVar5 = ::vk::isCompressedFormat(this->m_imageFormat);
  if (bVar5) {
    format = ::vk::mapVkCompressedFormat(this->m_imageFormat);
    TVar7 = tcu::getUncompressedFormat(format);
    channelType = TVar7.type;
  }
  else {
    TVar7 = ::vk::mapVkFormat(this->m_imageFormat);
    channelType = TVar7.type;
  }
  local_4a8.m_data[0] = 0.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 0.0;
  local_4b8.m_data[0] = 0.0;
  local_4b8.m_data[1] = 0.0;
  local_4b8.m_data[2] = 0.0;
  local_4b8.m_data[3] = 0.0;
  getLookupScaleBias(this->m_imageFormat,&local_4a8,&local_4b8);
  uVar3._0_4_ = (this->m_componentMapping).r;
  uVar3._4_4_ = (this->m_componentMapping).g;
  uVar4._0_4_ = (this->m_componentMapping).b;
  uVar4._4_4_ = (this->m_componentMapping).a;
  local_498 = 0xbf800000;
  local_490._0_4_ = 0x3f800000;
  local_490._4_4_ = local_4a8.m_data[0];
  fStack_488 = local_4a8.m_data[1];
  fStack_484 = local_4a8.m_data[2];
  aaStack_480[0]._M_allocated_capacity._0_4_ = local_4a8.m_data[3];
  aaStack_480[0]._M_allocated_capacity._4_4_ = 0xbf800000;
  local_4c8.m_data[0] = *(float *)((long)&local_498 + (uVar3 & 0xffffffff) * 4);
  local_4c8.m_data[1] = *(float *)((long)&local_498 + (uVar3 >> 0x20) * 4);
  local_4c8.m_data[2] = *(float *)((long)&local_498 + (uVar4 & 0xffffffff) * 4);
  local_4c8.m_data[3] = *(float *)((long)&local_498 + (uVar4 >> 0x20) * 4);
  local_498 = 0xbf800000;
  local_490._0_4_ = 0x3f800000;
  local_490._4_4_ = local_4b8.m_data[0];
  fStack_488 = local_4b8.m_data[1];
  fStack_484 = local_4b8.m_data[2];
  aaStack_480[0]._M_allocated_capacity._0_4_ = local_4b8.m_data[3];
  aaStack_480[0]._M_allocated_capacity._4_4_ = 0xbf800000;
  local_4d8.m_data[0] = *(float *)((long)&local_498 + (uVar3 & 0xffffffff) * 4);
  local_4d8.m_data[1] = *(float *)((long)&local_498 + (uVar3 >> 0x20) * 4);
  local_4d8.m_data[2] = *(float *)((long)&local_498 + (uVar4 & 0xffffffff) * 4);
  local_4d8.m_data[3] = *(float *)((long)&local_498 + (uVar4 >> 0x20) * 4);
  switch(this->m_imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    __s = "x";
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    __s = "xy";
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
  case VK_IMAGE_VIEW_TYPE_CUBE:
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    __s = "xyz";
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    __s = "xyzw";
    break;
  default:
    bVar5 = true;
    __s = (char *)0x0;
    goto LAB_004dc2be;
  }
  bVar5 = false;
LAB_004dc2be:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 440\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in vec4 position;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 1) in vec4 texCoords;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out highp vec4 vtxTexCoords;\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvec4 gl_Position;\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tgl_Position = position;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvtxTexCoords = texCoords;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 440\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(set = 0, binding = 0) uniform highp ",0x2b);
  VVar2 = this->m_imageViewType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  TVar6 = tcu::getTextureChannelClass(channelType);
  if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar11 = "u";
  }
  else {
    TVar6 = tcu::getTextureChannelClass(channelType);
    if (TVar6 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_004dc46d;
    pcVar11 = "i";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_498,pcVar11,1);
LAB_004dc46d:
  if (VVar2 < VK_IMAGE_VIEW_TYPE_LAST) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_498,&DAT_00b11070 + *(int *)(&DAT_00b11070 + (ulong)VVar2 * 4),
               *(long *)(&DAT_00b11090 + (ulong)VVar2 * 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,local_518._M_dataplus._M_p,local_518._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," texSampler;\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) in highp vec4 vtxTexCoords;\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"layout(location = 0) out highp vec4 fragColor;\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\tfragColor = ",0xd);
  paVar1 = &local_518.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != paVar1) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if (this->m_samplerLod <= 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"texture(texSampler, vtxTexCoords.",0x21);
    if (bVar5) {
      std::ios::clear((int)&local_518 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x1f8);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,")",1);
    *(uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18)) & 0xfffffefb | 4;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"textureLod(texSampler, vtxTexCoords.",0x24);
    if (bVar5) {
      std::ios::clear((int)&local_518 + (int)*(undefined8 *)(local_320[0] + -0x18) + 0x1f8);
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,__s,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,", ",2);
    *(uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18)) & 0xfffffefb | 4;
    poVar8 = std::ostream::_M_insert<double>((double)this->m_samplerLod);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," * vec4",7);
  *(uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18)) =
       *(uint *)((long)auStack_308 + *(long *)(local_320[0] + -0x18)) & 0xfffffefb | 0x100;
  poVar8 = tcu::operator<<((ostream *)local_320,&local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," + vec4",7);
  poVar8 = tcu::operator<<(poVar8,&local_4d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\n",2);
  local_518._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"tex_vert","");
  pPVar10 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_518);
  std::__cxx11::stringbuf::str();
  local_498 = local_498 & 0xffffffff00000000;
  local_490 = (undefined1  [8])aaStack_480;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_490,local_4f8,local_4f0 + (long)local_4f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar10->sources + (local_498 & 0xffffffff),(value_type *)local_490);
  if (local_490 != (undefined1  [8])aaStack_480) {
    operator_delete((void *)local_490,
                    CONCAT44(aaStack_480[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_480[0]._M_allocated_capacity) + 1);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8,local_4e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != paVar1) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  local_518._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"tex_frag","");
  pPVar10 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_518);
  std::__cxx11::stringbuf::str();
  local_498 = CONCAT44(local_498._4_4_,1);
  local_490 = (undefined1  [8])aaStack_480;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_490,local_4f8,local_4f0 + (long)local_4f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar10->sources + (local_498 & 0xffffffff),(value_type *)local_490);
  if (local_490 != (undefined1  [8])aaStack_480) {
    operator_delete((void *)local_490,
                    CONCAT44(aaStack_480[0]._M_allocated_capacity._4_4_,
                             (undefined4)aaStack_480[0]._M_allocated_capacity) + 1);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8,local_4e8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != paVar1) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ImageViewTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream				vertexSrc;
	std::ostringstream				fragmentSrc;
	const char*						texCoordSwizzle	= DE_NULL;
	const tcu::TextureFormat		format			= (isCompressedFormat(m_imageFormat)) ? tcu::getUncompressedFormat(mapVkCompressedFormat(m_imageFormat))
																						  : mapVkFormat(m_imageFormat);

	tcu::Vec4						lookupScale;
	tcu::Vec4						lookupBias;

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	tcu::Vec4						swizzledScale	= swizzle(lookupScale, m_componentMapping);
	tcu::Vec4						swizzledBias	= swizzle(lookupBias, m_componentMapping);

	switch (m_imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			texCoordSwizzle = "x";
			break;
		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_2D:
			texCoordSwizzle = "xy";
			break;
		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case VK_IMAGE_VIEW_TYPE_3D:
		case VK_IMAGE_VIEW_TYPE_CUBE:
			texCoordSwizzle = "xyz";
			break;
		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			texCoordSwizzle = "xyzw";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	vertexSrc << "#version 440\n"
			  << "layout(location = 0) in vec4 position;\n"
			  << "layout(location = 1) in vec4 texCoords;\n"
			  << "layout(location = 0) out highp vec4 vtxTexCoords;\n"
			  << "out gl_PerVertex {\n"
			  << "	vec4 gl_Position;\n"
			  << "};\n"
			  << "void main (void)\n"
			  << "{\n"
			  << "	gl_Position = position;\n"
			  << "	vtxTexCoords = texCoords;\n"
			  << "}\n";

	fragmentSrc << "#version 440\n"
				<< "layout(set = 0, binding = 0) uniform highp " << getGlslSamplerType(format, m_imageViewType) << " texSampler;\n"
				<< "layout(location = 0) in highp vec4 vtxTexCoords;\n"
				<< "layout(location = 0) out highp vec4 fragColor;\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "	fragColor = ";

	if (m_samplerLod > 0.0f)
		fragmentSrc << "textureLod(texSampler, vtxTexCoords." << texCoordSwizzle << ", " << std::fixed <<  m_samplerLod << ")";
	else
		fragmentSrc << "texture(texSampler, vtxTexCoords." << texCoordSwizzle << ")" << std::fixed;

	fragmentSrc << " * vec4" << std::scientific << swizzledScale << " + vec4" << swizzledBias << ";\n"
				<< "}\n";

	sourceCollections.glslSources.add("tex_vert") << glu::VertexSource(vertexSrc.str());
	sourceCollections.glslSources.add("tex_frag") << glu::FragmentSource(fragmentSrc.str());
}